

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  int *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"[x: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1," width: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  poVar1 = std::operator<<(poVar1," height: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[3]);
  std::operator<<(poVar1,"]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Rectangle3& rectangle)
    {
        os << "[x: " << rectangle.x << " y: " << rectangle.y
           << " width: " << rectangle.width << " height: " << rectangle.height << "]";
        return os;
    }